

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O0

void __thiscall Knn::getData(Knn *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  ostream *poVar4;
  ulong uVar5;
  long *plVar6;
  size_type sVar7;
  void *this_00;
  stringstream local_3f8 [8];
  stringstream stringin;
  istream local_260 [8];
  ifstream infile;
  string local_58 [8];
  string line;
  double onepoint;
  vector<double,_std::allocator<double>_> temData;
  string *filename_local;
  Knn *this_local;
  
  temData.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)filename;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&onepoint);
  std::__cxx11::string::string(local_58);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(&(this->super_Base).inData);
  std::ifstream::ifstream
            (local_260,
             (string *)
             temData.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,_S_in);
  poVar4 = std::operator<<((ostream *)&std::cout,"reading ...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)&onepoint);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_260,local_58);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      _Var3 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_3f8,local_58,_Var3);
      while( true ) {
        plVar6 = (long *)std::istream::operator>>
                                   ((istream *)local_3f8,(double *)((long)&line.field_2 + 8));
        bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
        if (!bVar2) break;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)&onepoint,
                   (value_type *)((long)&line.field_2 + 8));
      }
      sVar7 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)&onepoint);
      (this->super_Base).indim = sVar7;
      (this->super_Base).indim = (this->super_Base).indim - 1;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&(this->super_Base).inData,(vector<double,_std::allocator<double>_> *)&onepoint);
      std::__cxx11::stringstream::~stringstream(local_3f8);
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"total data is ");
  sVar7 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&(this->super_Base).inData);
  this_00 = (void *)std::ostream::operator<<(poVar4,sVar7);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::ifstream::~ifstream(local_260);
  std::__cxx11::string::~string(local_58);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&onepoint);
  return;
}

Assistant:

void Knn::getData(const std::string &filename) {
    //load data to a vector
    std::vector<double> temData;
    double onepoint;
    std::string line;
    inData.clear();
    std::ifstream infile(filename);
    std::cout<<"reading ..."<<std::endl;
    while(!infile.eof()){
        temData.clear();
        std::getline(infile, line);
        if(line.empty())
            continue;
        std::stringstream stringin(line);
        while(stringin >> onepoint){
            temData.push_back(onepoint);
        }
        indim = temData.size();
        indim -= 1;
        inData.push_back(temData);
    }
    std::cout<<"total data is "<<inData.size()<<std::endl;
}